

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O2

size_t __thiscall flow::Instr::replaceOperand(Instr *this,Value *old,Value *replacement)

{
  pointer ppVVar1;
  pointer ppVVar2;
  size_t i;
  size_t sVar3;
  
  ppVVar1 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVVar2 = (this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar3 = 0;
  for (i = 0; (long)ppVVar1 - (long)ppVVar2 >> 3 != i; i = i + 1) {
    if ((this->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
        super__Vector_impl_data._M_start[i] == old) {
      setOperand(this,i,replacement);
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t Instr::replaceOperand(Value* old, Value* replacement) {
  size_t count = 0;

  for (size_t i = 0, e = operands_.size(); i != e; ++i) {
    if (operands_[i] == old) {
      setOperand(i, replacement);
      ++count;
    }
  }

  return count;
}